

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O3

void __thiscall FParser::OPplus(FParser *this,svalue_t *result,int start,int n,int stop)

{
  FString FVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  svalue_t right;
  svalue_t left;
  svalue_t local_60;
  svalue_t local_48;
  
  local_48.string.Chars = FString::NullString.Nothing;
  local_48.type = 1;
  local_48.value.i = 0;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  local_60.string.Chars = FString::NullString.Nothing;
  local_60.type = 1;
  local_60.value.i = 0;
  EvaluateExpression(this,&local_48,start,n + -1);
  EvaluateExpression(this,&local_60,n + 1,stop);
  FVar1.Chars = local_48.string.Chars;
  if (local_48.type == 0) {
    if (local_60.type == 6) {
      floatvalue(&local_60);
      FString::Format(&result->string,"%s%4.4f",FVar1.Chars);
    }
    else if (local_60.type == 0) {
      FString::Format(&result->string,"%s%s",local_48.string.Chars,local_60.string.Chars);
    }
    else {
      uVar4 = intvalue(&local_60);
      FString::Format(&result->string,"%s%i",FVar1.Chars,(ulong)uVar4);
    }
    result->type = 0;
  }
  else {
    if ((local_48.type == 6) || (local_60.type == 6)) {
      result->type = 6;
      iVar2 = fixedvalue(&local_48);
      iVar3 = fixedvalue(&local_60);
    }
    else {
      result->type = 1;
      iVar2 = intvalue(&local_48);
      iVar3 = intvalue(&local_60);
    }
    (result->value).i = iVar3 + iVar2;
  }
  FString::~FString(&local_60.string);
  FString::~FString(&local_48.string);
  return;
}

Assistant:

void FParser::OPplus(svalue_t &result, int start, int n, int stop)
{
	svalue_t left, right;
	
	evaluate_leftnright(start, n, stop);
	
  	if (left.type == svt_string)
    {
      	if (right.type == svt_string)
		{
			result.string.Format("%s%s", left.string.GetChars(), right.string.GetChars());
		}
      	else if (right.type == svt_fixed)
		{
			result.string.Format("%s%4.4f", left.string.GetChars(), floatvalue(right));
		}
      	else
		{
	  		result.string.Format("%s%i", left.string.GetChars(), intvalue(right));
		}
      	result.type = svt_string;
    }
	// haleyjd: 8-17
	else if(left.type == svt_fixed || right.type == svt_fixed)
	{
		result.type = svt_fixed;
		result.value.f = fixedvalue(left) + fixedvalue(right);
	}
	else
	{
		result.type = svt_int;
		result.value.i = intvalue(left) + intvalue(right);
	}
}